

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_naive_counter(uint16_t *data,uint32_t len,uint32_t *flags)

{
  uint uVar1;
  ushort uVar2;
  undefined1 auVar3 [32];
  int i_2;
  long lVar4;
  int i;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 *puVar8;
  int k;
  uint uVar9;
  int iVar10;
  int j;
  undefined1 auVar11 [32];
  uint32_t out_counters [16];
  __m256i counters [16];
  __m256i masks [16];
  undefined1 local_4c0 [64];
  undefined8 local_480 [64];
  undefined1 auStack_280 [600];
  
  lVar4 = 0;
  lVar5 = 0;
  while (lVar5 != 0x10) {
    *(undefined8 *)((long)local_480 + lVar4) = 0;
    *(undefined8 *)((long)local_480 + lVar4 + 8) = 0;
    *(undefined8 *)((long)local_480 + lVar4 + 0x10) = 0;
    *(undefined8 *)((long)local_480 + lVar4 + 0x18) = 0;
    lVar5 = lVar5 + 1;
    auVar11 = vpbroadcastw_avx512vl();
    *(undefined1 (*) [32])(auStack_280 + lVar4) = auVar11;
    lVar4 = lVar4 + 0x20;
  }
  local_4c0 = ZEXT464(0) << 0x40;
  uVar7 = 0;
  for (uVar6 = 0; uVar6 != len >> 0x14; uVar6 = uVar6 + 1) {
    uVar1 = uVar7 + 0x10000;
    for (; uVar7 != uVar1; uVar7 = uVar7 + 1) {
      auVar11 = *(undefined1 (*) [32])(data + (ulong)uVar7 * 0x10);
      uVar9 = 0;
      for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 0x20) {
        auVar3 = vpand_avx2(auVar11,*(undefined1 (*) [32])(auStack_280 + lVar4));
        auVar3 = vpsrlw_avx2(auVar3,ZEXT416(uVar9));
        auVar3 = vpaddw_avx2(auVar3,*(undefined1 (*) [32])((long)local_480 + lVar4));
        *(undefined1 (*) [32])((long)local_480 + lVar4) = auVar3;
        uVar9 = uVar9 + 1;
      }
    }
    puVar8 = local_480;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      iVar10 = *(int *)(local_4c0 + lVar4 * 4);
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        iVar10 = iVar10 + (uint)*(ushort *)((long)puVar8 + lVar5 * 2);
      }
      *(int *)(local_4c0 + lVar4 * 4) = iVar10;
      *(undefined1 (*) [32])(local_480 + lVar4 * 4) = ZEXT432(0) << 0x40;
      puVar8 = puVar8 + 4;
    }
    uVar7 = uVar1;
  }
  for (uVar6 = (ulong)(uVar7 << 4); uVar6 < len; uVar6 = uVar6 + 1) {
    uVar2 = data[uVar6];
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      *(uint *)(local_4c0 + lVar4 * 4) =
           *(int *)(local_4c0 + lVar4 * 4) + (uint)((uVar2 >> ((uint)lVar4 & 0x1f) & 1) != 0);
    }
  }
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    flags[lVar4] = *(uint32_t *)(local_4c0 + lVar4 * 4);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_naive_counter(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i counters[16];
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm256_set1_epi16(1 << i);
        counters[i] = _mm256_set1_epi16(0);
    }
    uint32_t out_counters[16] = {0};

    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_update_cycles = n_cycles / 65536;

#define UPDATE(idx) counters[idx]  = _mm256_add_epi16(counters[idx],  _mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx))

    uint32_t pos = 0;
    for (size_t i = 0; i < n_update_cycles; ++i) { // each block of 2^16 values
        for (int k = 0; k < 65536; ++pos,++k) { // max sum of each 16-bit value in a register
            for (int p = 0; p < 16; ++p) // Not unrolled
                UPDATE(p);
        }

        // Compute vector sum
        for (int k = 0; k < 16; ++k) { // each flag register
            // Naive counter
            uint16_t* d = (uint16_t*)(&counters[k]);
            for (int j = 0; j < 16; ++j) // each uint16_t in the register
                out_counters[k] += d[j];

            counters[k] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef UPDATE

    return 0;
}